

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void parse_input_keymap(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *__filename;
  int *piVar4;
  undefined8 uVar5;
  wchar_t *pwVar6;
  size_t sVar7;
  long lVar8;
  uint index;
  allocator local_141;
  wstring local_140 [32];
  long local_120;
  size_type last;
  wchar_t line [32];
  wchar_t func_string [32];
  uint local_10;
  uint local_c;
  uint line_number;
  uint i;
  
  memset(char_keys,0,0xc4);
  memset(shift_keys,0,0xc4);
  memset(altgr_keys,0,0xc4);
  __filename = (char *)std::__cxx11::string::c_str();
  _stdin = freopen(__filename,"r",_stdin);
  if (_stdin == (FILE *)0x0) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    uVar5 = std::__cxx11::string::c_str();
    error(1,iVar2,"Error opening input keymap \'%s\'",uVar5);
  }
  local_c = 0xffffffff;
  local_10 = 0;
  do {
    iVar2 = feof(_stdin);
    if ((iVar2 != 0) || (local_c = local_c + 1, 0x80 < local_c)) goto LAB_001093b7;
    bVar1 = is_used_key(local_c);
    if (bVar1) {
      local_10 = local_10 + 1;
      pwVar6 = fgetws((wchar_t *)&last,0x80,_stdin);
      if (pwVar6 == (wchar_t *)0x0) {
        iVar2 = feof(_stdin);
        if (iVar2 != 0) {
LAB_001093b7:
          fclose(_stdin);
          if (local_10 < 0x6a) {
            uVar5 = std::__cxx11::string::c_str();
            error(1,0,"Too few lines in input keymap \'%s\'; There should be N_KEYS_DEFINED lines!",
                  uVar5);
          }
          return;
        }
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        uVar5 = std::__cxx11::string::c_str();
        error_at_line(1,iVar2,uVar5,local_10,"fgets() error");
      }
      sVar7 = wcslen((wchar_t *)&last);
      if (8 < sVar7) {
        uVar5 = std::__cxx11::string::c_str();
        error_at_line(1,0,uVar5,local_10,"Line too long!");
      }
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring(local_140,(wchar_t *)&last,&local_141);
      lVar8 = std::__cxx11::wstring::find_last_not_of((wchar_t *)local_140,0x10dcf4);
      std::__cxx11::wstring::~wstring(local_140);
      std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_141);
      local_120 = lVar8;
      if (lVar8 == -1) {
        uVar5 = std::__cxx11::string::c_str();
        error_at_line(1,0,uVar5,local_10,"No characters on line");
      }
      line[local_120 + -1] = L'\0';
    }
    bVar1 = is_char_key(local_c);
    if (bVar1) {
      uVar3 = to_char_keys_index(local_c);
      iVar2 = __isoc99_swscanf(&last,L"%lc %lc %lc",char_keys + uVar3,shift_keys + uVar3,
                               altgr_keys + uVar3);
      if (iVar2 < 1) {
        uVar5 = std::__cxx11::string::c_str();
        error_at_line(1,0,uVar5,local_10,"Too few input characters on line");
      }
    }
    bVar1 = is_func_key(local_c);
    if ((bVar1) && (local_c != 0x39)) {
      iVar2 = __isoc99_swscanf(&last,L"%7ls",line + 0x1e);
      if (iVar2 != 1) {
        uVar5 = std::__cxx11::string::c_str();
        error_at_line(1,0,uVar5,local_10,"Invalid function key string");
      }
      iVar2 = to_func_keys_index(local_c);
      wcscpy(func_keys[iVar2],line + 0x1e);
    }
  } while( true );
}

Assistant:

void parse_input_keymap()
{
    // custom map will be used; erase existing US keytables
    memset(char_keys,  '\0', sizeof(char_keys));
    memset(shift_keys, '\0', sizeof(shift_keys));
    memset(altgr_keys, '\0', sizeof(altgr_keys));

    stdin = freopen(args.keymap.c_str(), "r", stdin);
    if (stdin == NULL)
        error(EXIT_FAILURE, errno, "Error opening input keymap '%s'", args.keymap.c_str());

    unsigned int i = -1;
    unsigned int line_number = 0;
    wchar_t func_string[32];
    wchar_t line[32];

    while (!feof(stdin)) {

        if (++i >= sizeof(char_or_func)) break;                         // only ever read up to 128 keycode bindings (currently N_KEYS_DEFINED are used)

        if (is_used_key(i)) {
            ++line_number;
            if(fgetws(line, sizeof(line), stdin) == NULL) {
                if (feof(stdin)) break;
                else error_at_line(EXIT_FAILURE, errno, args.keymap.c_str(), line_number, "fgets() error");
            }
            // line at most 8 characters wide (func lines are "1234567\n", char lines are "1 2 3\n")
            if (wcslen(line) > 8)                                     // TODO: replace 8*2 with 8 and wcslen()!
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "Line too long!");
            // terminate line before any \r or \n
            std::wstring::size_type last = std::wstring(line).find_last_not_of(L"\r\n");
            if (last == std::wstring::npos)
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "No characters on line");
            line[last + 1] = '\0';
        }

        if (is_char_key(i)) {
            unsigned int index = to_char_keys_index(i);
            if (swscanf(line, L"%lc %lc %lc", &char_keys[index], &shift_keys[index], &altgr_keys[index]) < 1) {
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "Too few input characters on line");
            }
        }
        if (is_func_key(i)) {
            if (i == KEY_SPACE) continue;                                     // space causes empty string and trouble
            if (swscanf(line, L"%7ls", &func_string[0]) != 1)
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "Invalid function key string");                                                 // does this ever happen?
            wcscpy(func_keys[to_func_keys_index(i)], func_string);
        }
    }             // while (!feof(stdin))
    fclose(stdin);

    if (line_number < N_KEYS_DEFINED)
#define QUOTE(x) #x  // quotes x so it can be used as (char*)
        error(EXIT_FAILURE, 0, "Too few lines in input keymap '%s'; There should be " QUOTE(N_KEYS_DEFINED) " lines!", args.keymap.c_str());
}